

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O0

bool __thiscall Timidity::GF1Envelope::Update(GF1Envelope *this,Voice *v)

{
  bool bVar1;
  Voice *v_local;
  GF1Envelope *this_local;
  
  this->volume = this->increment + this->volume;
  if (((this->increment < 0) && (this->volume <= this->target)) ||
     ((0 < this->increment && (this->target <= this->volume)))) {
    this->volume = this->target;
    bVar1 = Recompute(this,v);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool GF1Envelope::Update(Voice *v)
{
	volume += increment;
	if (((increment < 0) && (volume <= target)) || ((increment > 0) && (volume >= target)))
	{
		volume = target;
		if (Recompute(v))
		{
			return 1;
		}
	}
	return 0;
}